

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_reduce_is_2k(mp_int *a)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar3 = a->used;
  if (1 < uVar3) {
    if (1 < (int)uVar3) {
      iVar2 = mp_count_bits(a);
      iVar4 = 0x3c;
      uVar5 = 1;
      uVar6 = 1;
      while( true ) {
        if (iVar2 <= iVar4) {
          return 1;
        }
        if ((a->dp[uVar5] & uVar6) == 0) break;
        bVar1 = uVar6 * 2 >> 0x3c != 0;
        uVar6 = uVar6 * 2;
        if (bVar1) {
          uVar6 = 1;
        }
        uVar5 = (ulong)((int)uVar5 + (uint)bVar1);
        iVar4 = iVar4 + 1;
      }
      return 0;
    }
    uVar3 = 1;
  }
  return uVar3;
}

Assistant:

int mp_reduce_is_2k(mp_int *a)
{
   int ix, iy, iw;
   mp_digit iz;
   
   if (a->used == 0) {
      return MP_NO;
   } else if (a->used == 1) {
      return MP_YES;
   } else if (a->used > 1) {
      iy = mp_count_bits(a);
      iz = 1;
      iw = 1;
    
      /* Test every bit from the second digit up, must be 1 */
      for (ix = DIGIT_BIT; ix < iy; ix++) {
          if ((a->dp[iw] & iz) == 0) {
             return MP_NO;
          }
          iz <<= 1;
          if (iz > (mp_digit)MP_MASK) {
             ++iw;
             iz = 1;
          }
      }
   }
   return MP_YES;
}